

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O0

ssize_t __thiscall testbench::memory::write(memory *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint uVar2;
  undefined7 extraout_var;
  reference psVar3;
  element_type *peVar4;
  uint local_44;
  undefined1 local_40 [8];
  shared_ptr<testbench::address_range> range;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
  *__range1;
  uchar value_local;
  uint address_local;
  memory *this_local;
  
  __end1 = std::
           vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
           ::begin(&this->ranges);
  range.super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
       ::end(&this->ranges);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<testbench::address_range>_*,_std::vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>_>
                                *)&range.
                                   super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
    if (!bVar1) {
      return CONCAT71(extraout_var,bVar1);
    }
    psVar3 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<testbench::address_range>_*,_std::vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<testbench::address_range>::shared_ptr
              ((shared_ptr<testbench::address_range> *)local_40,psVar3);
    peVar4 = std::
             __shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    uVar2 = (*peVar4->_vptr_address_range[1])();
    if ((uVar2 & 1) == 0) {
LAB_0010d869:
      local_44 = 0;
    }
    else {
      peVar4 = std::
               __shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      uVar2 = (*peVar4->_vptr_address_range[2])(peVar4,(ulong)(uint)__fd);
      if ((uVar2 & 1) == 0) goto LAB_0010d869;
      peVar4 = std::
               __shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      uVar2 = (**peVar4->_vptr_address_range)();
      if ((uVar2 & 1) != 0) {
        peVar4 = std::
                 __shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<testbench::address_range,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
        (*peVar4->_vptr_address_range[4])(peVar4,(ulong)(uint)__fd,(ulong)__buf & 0xff);
      }
      local_44 = 1;
    }
    std::shared_ptr<testbench::address_range>::~shared_ptr
              ((shared_ptr<testbench::address_range> *)local_40);
    if (local_44 != 0) {
      return (ulong)local_44;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testbench::address_range>_*,_std::vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void memory::write(unsigned address, unsigned char value) noexcept
{
    for (auto range : ranges) {
        if (range->is_visible() and range->contains(address)) {
            if (range->is_writable()) {
                range->write(address, value);
            }
            return;
        }
    }
}